

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O1

bool __thiscall Jinx::Impl::Lexer::Execute(Lexer *this)

{
  byte bVar1;
  char *pcVar2;
  byte *utf8Str;
  pointer pSVar3;
  bool bVar4;
  uint uVar5;
  size_t sVar6;
  SymbolType SVar7;
  
  pcVar2 = this->m_start;
  this->m_current = pcVar2;
  if ((*pcVar2 != '\0') && (pcVar2 <= this->m_end)) {
    while( true ) {
      ParseWhitespace(this);
      utf8Str = (byte *)this->m_current;
      bVar1 = *utf8Str;
      uVar5 = (uint)bVar1;
      if ((bVar1 == 0xd) || (bVar1 == 10)) {
        ParseEndOfLine(this);
        goto LAB_0011a0b4;
      }
      if ((bVar1 == 0) || (this->m_end < utf8Str)) break;
      if (0x5a < bVar1) {
        if (bVar1 < 0x7b) {
          if (uVar5 == 0x5b) {
            SVar7 = SquareOpen;
          }
          else {
            if (uVar5 != 0x5d) goto switchD_00119eca_caseD_23;
            SVar7 = SquareClose;
          }
        }
        else if (uVar5 == 0x7b) {
          SVar7 = CurlyOpen;
        }
        else {
          if (uVar5 != 0x7d) goto switchD_00119eca_caseD_23;
          SVar7 = CurlyClose;
        }
        goto LAB_0011a099;
      }
      switch(bVar1) {
      case 0x21:
        if (utf8Str[1] == 0x3d) {
          SVar7 = NotEquals;
LAB_00119f9a:
          CreateSymbol(this,SVar7);
          sVar6 = GetUtf8CharSize(this->m_current);
          this->m_current = this->m_current + sVar6;
          this->m_columnNumber = this->m_columnNumber + 1;
        }
        else {
          Error<>(this,"Invalid symbol \'!\'");
        }
        goto LAB_0011a09e;
      case 0x22:
        ParseString(this);
        goto LAB_0011a09e;
      default:
        goto switchD_00119eca_caseD_23;
      case 0x25:
        SVar7 = Percent;
        break;
      case 0x28:
        SVar7 = ParenOpen;
        break;
      case 0x29:
        SVar7 = ParenClose;
        break;
      case 0x2a:
        SVar7 = Asterisk;
        break;
      case 0x2b:
        bVar4 = IsNextDigit(this);
        if (!bVar4) {
          SVar7 = Plus;
          break;
        }
        sVar6 = GetUtf8CharSize((char *)utf8Str);
        this->m_current = this->m_current + sVar6;
        this->m_columnNumber = this->m_columnNumber + 1;
        goto LAB_0011a087;
      case 0x2c:
        SVar7 = Comma;
        break;
      case 0x2d:
        if (utf8Str[1] != 0x2d) {
          bVar4 = IsNextDigit(this);
          if (bVar4) goto LAB_0011a087;
          SVar7 = Minus;
          break;
        }
        ParseComment(this);
        goto LAB_0011a0b4;
      case 0x2e:
        if (utf8Str[1] == 0x2e) {
          ParseEllipse(this);
          goto LAB_0011a0b4;
        }
        goto switchD_00119eca_caseD_23;
      case 0x2f:
        SVar7 = ForwardSlash;
        break;
      case 0x3c:
        if (utf8Str[1] == 0x3d) {
          SVar7 = LessThanEquals;
          goto LAB_00119f9a;
        }
        SVar7 = LessThan;
        break;
      case 0x3d:
        SVar7 = Equals;
        break;
      case 0x3e:
        if (utf8Str[1] == 0x3d) {
          SVar7 = GreaterThanEquals;
          goto LAB_00119f9a;
        }
        SVar7 = GreaterThan;
      }
LAB_0011a099:
      CreateSymbol(this,SVar7);
LAB_0011a09e:
      if (this->m_error != false) break;
      sVar6 = GetUtf8CharSize(this->m_current);
      this->m_current = this->m_current + sVar6;
      this->m_columnNumber = this->m_columnNumber + 1;
LAB_0011a0b4:
      if ((*this->m_current == '\0') || (this->m_end < this->m_current)) break;
    }
  }
  pSVar3 = (this->m_symbolList).
           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (((this->m_symbolList).
       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>._M_impl.
       super__Vector_impl_data._M_start != pSVar3) && (pSVar3[-1].type != NewLine)) {
    CreateSymbol(this,NewLine);
  }
  return (bool)(this->m_error ^ 1);
switchD_00119eca_caseD_23:
  if ((byte)(bVar1 - 0x2d) < 2 || uVar5 - 0x30 < 10) {
LAB_0011a087:
    ParseNumber(this);
  }
  else {
    ParseName(this);
  }
  goto LAB_0011a0b4;
}

Assistant:

inline_t bool Lexer::Execute()
	{
		m_current = m_start;

		// Create a list of tokens for the parser to analyze
		while (!IsEndOfText())
		{
			// Advance past any whitespace
			ParseWhitespace();

			// Check for end of line character
			if (IsNewline(*m_current))
			{
				// Advance past end of line
				ParseEndOfLine();
				continue;
			}

			// May have reached end of text after parsing whitespace or end of line
			if (IsEndOfText())
				break;

			// Check for operators first
			unsigned char c = *m_current;
			switch (c)
			{
			case '-':
				if (IsNextCharacter('-'))
				{
					ParseComment();
					continue;
				}
				else if (IsNextDigit())
				{
					ParseNumber();
					continue;
				}
				else
					CreateSymbol(SymbolType::Minus);
				break;
			case '<':
				if (IsNextCharacter('='))
				{
					CreateSymbol(SymbolType::LessThanEquals);
					AdvanceCurrent();
				}
				else
				{
					CreateSymbol(SymbolType::LessThan);
				}
				break;
			case '>':
				if (IsNextCharacter('='))
				{
					CreateSymbol(SymbolType::GreaterThanEquals);
					AdvanceCurrent();
				}
				else
				{
					CreateSymbol(SymbolType::GreaterThan);
				}
				break;
			case '"':
				ParseString();
				break;
			case '*':
				CreateSymbol(SymbolType::Asterisk);
				break;
			case '/':
				CreateSymbol(SymbolType::ForwardSlash);
				break;
			case '+':
				if (IsNextDigit())
				{
					AdvanceCurrent();
					ParseNumber();
					continue;
				}
				else
					CreateSymbol(SymbolType::Plus);
				break;
			case '=':
				CreateSymbol(SymbolType::Equals);
				break;
			case '!':
				if (IsNextCharacter('='))
				{
					CreateSymbol(SymbolType::NotEquals);
					AdvanceCurrent();
				}
				else
				{
					Error("Invalid symbol '!'");
					break;
				}
				break;
			case '%':
				CreateSymbol(SymbolType::Percent);
				break;
			case ',':
				CreateSymbol(SymbolType::Comma);
				break;
			case '(':
				CreateSymbol(SymbolType::ParenOpen);
				break;
			case ')':
				CreateSymbol(SymbolType::ParenClose);
				break;
			case '{':
				CreateSymbol(SymbolType::CurlyOpen);
				break;
			case '}':
				CreateSymbol(SymbolType::CurlyClose);
				break;
			case '[':
				CreateSymbol(SymbolType::SquareOpen);
				break;
			case ']':
				CreateSymbol(SymbolType::SquareClose);
				break;
			default:
			{
				if (c == '.' && IsNextCharacter('.'))
					ParseEllipse();
				else
				{
					if (IsNumberStart(c))
						ParseNumber();
					else
						ParseName();
				}
				continue;
			}
			};

			// Check for errors
			if (m_error)
				break;

			// Advance one UTF-8 character
			AdvanceCurrent();
		}

		// Make sure programs always end with a new line marker for parsing consistency
		if (!m_symbolList.empty() && m_symbolList.back().type != SymbolType::NewLine)
			CreateSymbol(SymbolType::NewLine);

		// Return error status
		return !m_error;
	}